

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O1

int __thiscall mahjong::PlayerHand::bonusTileCount(PlayerHand *this,WiningState *state)

{
  pointer pMVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  Meld *it;
  pointer this_00;
  
  iVar4 = 0;
  for (p_Var3 = (this->tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->tiles)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    iVar2 = WiningState::bonusTileCount(state,p_Var3[1]._M_color);
    iVar4 = iVar4 + iVar2;
  }
  pMVar1 = (this->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pMVar1; this_00 = this_00 + 1)
  {
    iVar2 = Meld::bonusTileCount(this_00,state);
    iVar4 = iVar4 + iVar2;
  }
  return iVar4;
}

Assistant:

int PlayerHand::bonusTileCount(const WiningState& state) const
{
	auto bonus_tile_count = 0;

	for (auto it : tiles)
	{
		bonus_tile_count += state.bonusTileCount(it);
	}

	for (const auto& it : melds)
	{
		bonus_tile_count += it.bonusTileCount(state);
	}

	return bonus_tile_count;
}